

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

void __thiscall QDirPrivate::initFileLists(QDirPrivate *this,QDir *dir)

{
  FileCache *this_00;
  __pointer_type copy;
  QDirPrivate *pQVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QArrayDataPointer<QString> local_80;
  QString local_68;
  QDirListing local_50;
  QArrayDataPointer<QFileInfo> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fileCache;
  if ((this->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_0022a3b6;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_0022a3b6:
  if (((this->fileCache).fileListsInitialized._M_base._M_i & 1U) == 0) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (QFileInfo *)0x0;
    local_48.size = 0;
    QFileSystemEntry::filePath(&local_68,&((dir->d_ptr).d.ptr)->dirEntry);
    pQVar1 = (dir->d_ptr).d.ptr;
    local_80.d = (pQVar1->nameFilters).d.d;
    local_80.ptr = (pQVar1->nameFilters).d.ptr;
    local_80.size = (pQVar1->nameFilters).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar1 = (dir->d_ptr).d.ptr;
    }
    QDirListing::QDirListing
              (&local_50,&local_68,(QStringList *)&local_80,
               (pQVar1->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
               super_QFlagsStorage<QDir::Filter>.i,0);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
    if ((QDirListingPrivate *)local_68.d.d != (QDirListingPrivate *)0x0) {
      LOCK();
      *(int *)&(((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                &(local_68.d.d)->super_QArrayData)->_M_t).
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
           *(int *)&(((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     &(local_68.d.d)->super_QArrayData)->_M_t).
                    super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                    .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl + -1;
      UNLOCK();
      if (*(int *)&(((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                    &(local_68.d.d)->super_QArrayData)->_M_t).
                   super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                   .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.d.d = (Data *)QDirListing::begin(&local_50);
    for (; (QDirListingPrivate *)local_68.d.d != (QDirListingPrivate *)0x0;
        local_68.d.d = (Data *)QDirListing::next((DirEntry)local_68.d.d)) {
      QDirListing::DirEntry::fileInfo((DirEntry *)&local_80);
      QtPrivate::QMovableArrayOps<QFileInfo>::emplace<QFileInfo>
                ((QMovableArrayOps<QFileInfo> *)&local_48,local_48.size,(QFileInfo *)&local_80);
      QList<QFileInfo>::end((QList<QFileInfo> *)&local_48);
      QFileInfo::~QFileInfo((QFileInfo *)&local_80);
    }
    QDirListing::~QDirListing(&local_50);
    sortFileList((SortFlags)
                 (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                 super_QFlagsStorage<QDir::SortFlag>.i,(QFileInfoList *)&local_48,
                 &(this->fileCache).files,&(this->fileCache).fileInfos);
    LOCK();
    (this->fileCache).fileListsInitialized._M_base._M_i = true;
    UNLOCK();
    QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_48);
  }
  LOCK();
  copy = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QDirPrivate::initFileLists(const QDir &dir) const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.fileListsInitialized) {
        QFileInfoList l;
        for (const auto &dirEntry : QDirListing(dir.path(), dir.nameFilters(),
                                                dir.filter().toInt())) {
            l.emplace_back(dirEntry.fileInfo());
        }

        sortFileList(sort, l, &fileCache.files, &fileCache.fileInfos);
        fileCache.fileListsInitialized = true;
    }
}